

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxBone::PmxBone(PmxBone *this)

{
  int local_14;
  int i;
  PmxBone *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->bone_english_name);
  this->parent_index = 0;
  this->level = 0;
  this->bone_flag = 0;
  this->target_index = 0;
  this->grant_parent_index = 0;
  this->grant_weight = 0.0;
  this->key = 0;
  this->ik_target_bone_index = 0;
  this->ik_loop = 0;
  this->ik_loop_angle_limit = 0.0;
  this->ik_link_count = 0;
  std::unique_ptr<pmx::PmxIkLink[],std::default_delete<pmx::PmxIkLink[]>>::
  unique_ptr<std::default_delete<pmx::PmxIkLink[]>,void>
            ((unique_ptr<pmx::PmxIkLink[],std::default_delete<pmx::PmxIkLink[]>> *)&this->ik_links);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    this->position[local_14] = 0.0;
    this->offset[local_14] = 0.0;
    this->lock_axis_orientation[local_14] = 0.0;
    this->local_axis_x_orientation[local_14] = 0.0;
    this->local_axis_y_orientation[local_14] = 0.0;
  }
  return;
}

Assistant:

PmxBone()
			: parent_index(0)
			, level(0)
			, bone_flag(0)
			, target_index(0)
			, grant_parent_index(0)
			, grant_weight(0.0f)
			, key(0)
			, ik_target_bone_index(0)
			, ik_loop(0)
			, ik_loop_angle_limit(0.0f)
			, ik_link_count(0)
		{
			for (int i = 0; i < 3; ++i) {
				position[i] = 0.0f;
				offset[i] = 0.0f;
				lock_axis_orientation[i] = 0.0f;
				local_axis_x_orientation[i] = 0.0f;
				local_axis_y_orientation[i] = 0.0f;
			}
		}